

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_ReadSmallCord_Test::TestBody
          (IoTest_ReadSmallCord_Test *this)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_R9;
  AssertHelper local_1e8;
  Message local_1e0;
  string_view local_1d8;
  Cord local_1c8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_;
  CordInputStream input;
  Cord dest;
  string_view local_30;
  undefined1 local_20 [8];
  Cord source;
  IoTest_ReadSmallCord_Test *this_local;
  
  source.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)this;
  absl::lts_20250127::Cord::Cord((Cord *)local_20);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"foo bar");
  absl::lts_20250127::Cord::Append((Cord *)local_20,local_30);
  absl::lts_20250127::Cord::Cord((Cord *)&input.available_);
  CordInputStream::CordInputStream((CordInputStream *)&gtest_ar_.message_,(Cord *)local_20);
  local_129 = CordInputStream::Skip((CordInputStream *)&gtest_ar_.message_,1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_128,
               (AssertionResult *)"input.Skip(1)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x38f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  sVar3 = absl::lts_20250127::Cord::size((Cord *)local_20);
  local_171 = CordInputStream::ReadCord
                        ((CordInputStream *)&gtest_ar_.message_,(Cord *)&input.available_,
                         (int)sVar3 + -2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_170,
               (AssertionResult *)"input.ReadCord(&dest, source.size() - 2)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x390,pcVar2);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"oo ba");
  absl::lts_20250127::Cord::Cord(&local_1c8,local_1d8);
  testing::internal::EqHelper::Compare<absl::lts_20250127::Cord,_absl::lts_20250127::Cord,_nullptr>
            ((EqHelper *)local_1b8,"absl::Cord(\"oo ba\")","dest",&local_1c8,
             (Cord *)&input.available_);
  absl::lts_20250127::Cord::~Cord(&local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x392,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  CordInputStream::~CordInputStream((CordInputStream *)&gtest_ar_.message_);
  absl::lts_20250127::Cord::~Cord((Cord *)&input.available_);
  absl::lts_20250127::Cord::~Cord((Cord *)local_20);
  return;
}

Assistant:

TEST_F(IoTest, ReadSmallCord) {
  absl::Cord source;
  source.Append("foo bar");

  absl::Cord dest;
  CordInputStream input(&source);
  EXPECT_TRUE(input.Skip(1));
  EXPECT_TRUE(input.ReadCord(&dest, source.size() - 2));

  EXPECT_EQ(absl::Cord("oo ba"), dest);
}